

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:214:32)>
::getImpl(SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:214:32)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<int>_> *pEVar1;
  int *in;
  Promise<int> local_540;
  ExceptionOr<kj::Promise<int>_> local_538;
  int *local_390;
  int *depValue;
  int *_depValue779;
  Exception *local_1d8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1b8 [8];
  ExceptionOr<int> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:214:32)>
  *this_local;
  
  depResult.value.ptr = (NullableValue<int>)output;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)local_1b8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<int>((Maybe<int> *)
                              ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                      details.builder + 0x18));
    if (depValue != (int *)0x0) {
      local_390 = depValue;
      in = mv<int>(depValue);
      MaybeVoidCaller<int,kj::Promise<int>>::
      apply<kj::(anonymous_namespace)::TestCase207::run()::__2>
                ((MaybeVoidCaller<int,kj::Promise<int>> *)&local_540,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Promise<int>>
                (&local_538,&this->super_TransformPromiseNodeBase,&local_540);
      pEVar1 = ExceptionOrValue::as<kj::Promise<int>>((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<kj::Promise<int>_>::operator=(pEVar1,&local_538);
      ExceptionOr<kj::Promise<int>_>::~ExceptionOr(&local_538);
      Promise<int>::~Promise(&local_540);
    }
  }
  else {
    local_1d8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<int>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<int>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<int>>((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<kj::Promise<int>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<int>_> *)&_depValue779);
    ExceptionOr<kj::Promise<int>_>::~ExceptionOr((ExceptionOr<kj::Promise<int>_> *)&_depValue779);
  }
  ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }